

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

Value<char> * __thiscall Qentem::Value<char>::GetValue(Value<char> *this,char *key,SizeT length)

{
  ValueType VVar1;
  undefined8 in_RAX;
  Value<char> *pVVar2;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  for (; VVar1 = this->type_, VVar1 == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (VVar1 == Array) {
    Digit::FastStringToNumber<unsigned_int,char>(&local_14,key,length);
    if ((local_14 < (this->field_0).array_.index_) &&
       (pVVar2 = (this->field_0).array_.storage_, pVVar2[local_14].type_ != Undefined)) {
      return pVVar2 + local_14;
    }
  }
  else if (((VVar1 == Object) &&
           (pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::GetValue
                               ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,key,
                                length), pVVar2 != (Value<char> *)0x0)) &&
          (pVVar2->type_ != Undefined)) {
    return pVVar2;
  }
  return (Value<char> *)0x0;
}

Assistant:

Value *GetValue(const Char_T *key, SizeT length) const noexcept {
        switch (Type()) {
            case ValueType::Object: {
                Value *val = object_.GetValue(key, length);

                if ((val != nullptr) && !(val->isUndefined())) {
                    return val;
                }

                return nullptr;
            }

            case ValueType::Array: {
                SizeT index;
                Digit::FastStringToNumber(index, key, length);

                if (index < array_.Size()) {
                    Value *val = (array_.Storage() + index);

                    if (!(val->isUndefined())) {
                        return val;
                    }
                }

                return nullptr;
            }

            case ValueType::ValuePtr: {
                return value_->GetValue(key, length);
            }

            default:
                return nullptr;
        }
    }